

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnBrTableTarget(TypeChecker *this,Index depth)

{
  _anonymous_namespace_ *this_00;
  int *piVar1;
  _Alloc_hider _Var2;
  Result RVar3;
  char *prefix;
  int *piVar4;
  int *piVar5;
  _anonymous_namespace_ *this_01;
  bool bVar6;
  string local_70;
  string local_50;
  Label *local_30;
  Label *label;
  
  RVar3 = GetLabel(this,depth,&local_30);
  if (RVar3.enum_ != Error) {
    this_01 = (_anonymous_namespace_ *)&local_30->result_types;
    if (local_30->label_type == Loop) {
      this_01 = (_anonymous_namespace_ *)&local_30->param_types;
    }
    RVar3 = CheckSignature(this,(TypeVector *)this_01,"br_table");
    prefix = (char *)0x0;
    if (this->br_table_sig_ == (TypeVector *)0x0) {
      this->br_table_sig_ = (TypeVector *)this_01;
    }
    this_00 = (_anonymous_namespace_ *)this->br_table_sig_;
    piVar4 = *(int **)this_00;
    piVar1 = *(int **)(this_00 + 8);
    piVar5 = *(int **)this_01;
    if ((long)piVar1 - (long)piVar4 == *(long *)(this_01 + 8) - (long)piVar5) {
      bVar6 = piVar4 == piVar1;
      if (bVar6) {
LAB_00f675e8:
        if (bVar6) {
          return (Result)(uint)(RVar3.enum_ == Error);
        }
      }
      else if (*piVar4 == *piVar5) {
        do {
          piVar5 = piVar5 + 1;
          piVar4 = piVar4 + 1;
          bVar6 = piVar4 == piVar1;
          if (bVar6) goto LAB_00f675e8;
        } while (*piVar4 == *piVar5);
      }
    }
    (anonymous_namespace)::TypesToString_abi_cxx11_(&local_70,this_00,(TypeVector *)0x0,(char *)0x0)
    ;
    _Var2._M_p = local_70._M_dataplus._M_p;
    (anonymous_namespace)::TypesToString_abi_cxx11_(&local_50,this_01,(TypeVector *)0x0,prefix);
    PrintError(this,"br_table labels have inconsistent types: expected %s, got %s",_Var2._M_p,
               local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return (Result)Error;
}

Assistant:

Result TypeChecker::OnBrTableTarget(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckSignature(label_sig, "br_table");

  // Make sure this label's signature is consistent with the previous labels'
  // signatures.
  if (br_table_sig_ == nullptr) {
    br_table_sig_ = &label_sig;
  }
  if (*br_table_sig_ != label_sig) {
    result |= Result::Error;
    PrintError("br_table labels have inconsistent types: expected %s, got %s",
               TypesToString(*br_table_sig_).c_str(),
               TypesToString(label_sig).c_str());
  }

  return result;
}